

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec_filter.hxx
# Opt level: O2

bool __thiscall
cryptox::basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::
filter(basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
       *this,char **src_begin,char *src_end,char **dest_begin,char *dest_end,bool must_flush)

{
  deque<char,_std::allocator<char>_> *d_first;
  char *first;
  char *pcVar1;
  _Elt_pointer pcVar2;
  size_type sVar3;
  ulong __n;
  bool bVar4;
  _Self local_f8;
  const_iterator local_d8;
  iterator local_b0;
  _Self local_90;
  const_iterator local_70;
  _Deque_iterator<char,_char_&,_char_*> local_50;
  
  first = *src_begin;
  pcVar1 = *dest_begin;
  d_first = &this->_output;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  ::update<char_const*,std::back_insert_iterator<std::deque<char,std::allocator<char>>>>
            ((evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
              *)(this->_endec)._M_ptr,first,src_end,
             (back_insert_iterator<std::deque<char,_std::allocator<char>_>_>)d_first);
  this->_total_input = (size_t)(src_end + (this->_total_input - (long)*src_begin));
  *src_begin = src_end;
  sVar3 = std::deque<char,_std::allocator<char>_>::size(d_first);
  pcVar2 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
  if ((this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur != pcVar2) {
    __n = (long)dest_end - (long)pcVar1;
    if (sVar3 < (ulong)((long)dest_end - (long)pcVar1)) {
      __n = sVar3;
    }
    local_50._M_first =
         (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_50._M_last =
         (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_50._M_node =
         (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
         super__Deque_impl_data._M_start._M_node;
    local_50._M_cur = pcVar2;
    std::copy_n<std::_Deque_iterator<char,char&,char*>,unsigned_long,char*>
              (&local_50,__n,*dest_begin);
    local_90._M_cur =
         (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    local_90._M_first =
         (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
         super__Deque_impl_data._M_start._M_first;
    local_90._M_last =
         (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_90._M_node =
         (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
         super__Deque_impl_data._M_start._M_node;
    local_70._M_cur = local_90._M_cur;
    local_70._M_first = local_90._M_first;
    local_70._M_last = local_90._M_last;
    local_70._M_node = local_90._M_node;
    std::operator+(&local_f8,&local_90,__n);
    local_d8._M_cur = local_f8._M_cur;
    local_d8._M_first = local_f8._M_first;
    local_d8._M_last = local_f8._M_last;
    local_d8._M_node = local_f8._M_node;
    std::deque<char,_std::allocator<char>_>::erase(&local_b0,d_first,&local_70,&local_d8);
    *dest_begin = *dest_begin + __n;
    this->_total_output = this->_total_output + __n;
  }
  if (must_flush) {
    finalize(this);
    bVar4 = (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (this->_output).super__Deque_base<char,_std::allocator<char>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  }
  else {
    bVar4 = first == src_end;
  }
  return !bVar4;
}

Assistant:

bool filter(const char*& src_begin, const char* src_end, char*& dest_begin, char* dest_end, bool must_flush) {
			const size_t  input_size = std::distance( src_begin,  src_end);
			const size_t output_size = std::distance(dest_begin, dest_end);

			// Process Input...
			_endec->update(src_begin, src_end, std::back_inserter(_output));
			_total_input += std::distance(src_begin, src_end);
			src_begin = src_end;

			// Process Output...
			const size_t output_capacity = std::min BOOST_PREVENT_MACRO_SUBSTITUTION(
				output_size,
				_output.size()
			);

			if (!_output.empty()) {
				std::copy_n(_output.begin(), output_capacity, dest_begin);
				_output.erase(_output.begin(), _output.begin() + output_capacity);
				dest_begin += output_capacity;
				_total_output += output_capacity;
			}

			if (must_flush) {
				finalize();
				return !_output.empty();
			}

			return input_size != 0;
		}